

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addFunc
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,
          _Uninitialized<wasm::Function_*,_true> param_3,char *param_4,undefined8 exports,
          ImportNames *import,undefined8 param_7,undefined8 *param_8,Index param_9)

{
  undefined8 *puVar1;
  long *plVar2;
  _Uninitialized<wasm::Function_*,_true> _Var3;
  Result<wasm::Ok> *pRVar4;
  Name name;
  undefined1 local_d0 [8];
  Result<wasm::Function_*> f;
  long *local_88;
  undefined8 local_80;
  long local_78;
  undefined8 uStack_70;
  Result<wasm::Ok> *local_68;
  undefined1 local_60 [8];
  Result<wasm::Ok> _val;
  
  f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._32_8_ = exports;
  local_68 = __return_storage_ptr__;
  checkImport((Result<wasm::Ok> *)local_60,this,param_9,import);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    _Var3._M_storage =
         (Function *)
         ((long)&f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Function_*,_wasm::Err> + 8);
    local_d0 = (undefined1  [8])_Var3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,local_60,
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_60);
    pRVar4 = local_68;
    puVar1 = (undefined8 *)
             ((long)&(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    if (local_d0 == (undefined1  [8])_Var3._M_storage) {
      *puVar1 = f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
                super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._M_u._8_8_;
      *(undefined8 *)
       ((long)&(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_d0;
      *(undefined8 *)
       ((long)&(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._M_u._8_8_;
    }
    ((_Uninitialized<wasm::Function_*,_true> *)
    ((long)&(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8))->_M_storage =
         (Function *)
         f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
         super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
         super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
         super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
         super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._M_u._M_first._M_storage;
    *(__index_type *)
     ((long)&(local_68->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
    name.super_IString.str._M_str = param_4;
    name.super_IString.str._M_len = (size_t)param_3._M_storage;
    addFuncDecl((Result<wasm::Function_*> *)local_d0,this,param_9,name,import);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Function_*,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Function_*,_wasm::Err> *)local_60,
               (_Copy_ctor_base<false,_wasm::Function_*,_wasm::Err> *)local_d0);
    pRVar4 = local_68;
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      local_88 = &local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_60,
                 _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_60);
      plVar2 = (long *)((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(long **)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> = plVar2;
      if (local_88 == &local_78) {
        *plVar2 = local_78;
        *(undefined8 *)
         ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_70;
      }
      else {
        *(long **)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_88;
        *(long *)((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_78;
      }
      *(undefined8 *)
       ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_80;
      *(__index_type *)
       ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::Function_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Function_*,_wasm::Err> *)local_60);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Function_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Function_*,_wasm::Err> *)local_60);
      anon_unknown_2::addExports
                ((Result<wasm::Ok> *)local_60,(anon_unknown_2 *)this,(Lexer *)this->wasm,
                 (Module *)local_d0,
                 *(Named **)
                  f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
                  super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._32_8_,
                 *(vector<wasm::Name,_std::allocator<wasm::Name>_> **)
                  (f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._32_8_ + 8),Function);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        local_88 = &local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,local_60,
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_60);
        plVar2 = (long *)((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(long **)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> = plVar2;
        if (local_88 == &local_78) {
          *plVar2 = local_78;
          *(undefined8 *)
           ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_70;
        }
        else {
          *(long **)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_88;
          *(long *)((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_78;
        }
        *(undefined8 *)
         ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_80;
        *(__index_type *)
         ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_4_ = param_9;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._12_4_ =
             (int)((ulong)((long)(this->funcDefs).
                                 super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->funcDefs).
                                super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_ = *param_8;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_8_ = param_8[1];
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = param_8[2];
        *param_8 = 0;
        param_8[1] = 0;
        param_8[2] = 0;
        local_60 = (undefined1  [8])param_3._M_storage;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = param_4;
        std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::
        emplace_back<wasm::WATParser::DefPos>(&this->funcDefs,(DefPos *)local_60);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_ != 0) {
          operator_delete((void *)_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_,
                          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ -
                          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_);
        }
        *(__index_type *)
         ((long)&(pRVar4->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Function_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Function_*,_wasm::Err> *)local_d0);
  }
  return pRVar4;
}

Assistant:

Result<> ParseDeclsCtx::addFunc(Name name,
                                const std::vector<Name>& exports,
                                ImportNames* import,
                                TypeUseT type,
                                std::optional<LocalsT>,
                                std::vector<Annotation>&& annotations,
                                Index pos) {
  CHECK_ERR(checkImport(pos, import));
  auto f = addFuncDecl(pos, name, import);
  CHECK_ERR(f);
  CHECK_ERR(addExports(in, wasm, *f, exports, ExternalKind::Function));
  funcDefs.push_back(
    {name, pos, Index(funcDefs.size()), std::move(annotations)});
  return Ok{};
}